

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O0

void __thiscall
duckdb::ZSTDCompressionState::CompressString
          (ZSTDCompressionState *this,string_t *string,bool end_of_vector)

{
  uint uVar1;
  idx_t iVar2;
  undefined8 uVar3;
  byte in_DL;
  string_t *in_RSI;
  ZSTD_inBuffer *in_RDI;
  unsigned_long diff;
  idx_t old_pos;
  size_t compress_result;
  anon_enum_32 end_mode;
  ZSTD_inBuffer in_buffer;
  string_t *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff38;
  ZSTDCompressionState *in_stack_ffffffffffffff40;
  allocator *paVar4;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  allocator in_stack_ffffffffffffff57;
  ZSTD_CCtx *in_stack_ffffffffffffff58;
  InvalidInputException *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  InternalException *in_stack_ffffffffffffff70;
  allocator local_71;
  string local_70 [32];
  long local_50;
  void *local_48;
  size_t local_40;
  undefined4 local_34;
  char *local_30;
  idx_t local_28;
  undefined8 local_20;
  byte local_11;
  string_t *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_30 = string_t::GetData(in_stack_ffffffffffffff20);
  local_28 = string_t::GetSize(local_10);
  local_20 = 0;
  if (((local_11 & 1) != 0) || (iVar2 = string_t::GetSize(local_10), iVar2 != 0)) {
    iVar2 = string_t::GetSize(local_10);
    in_RDI[0xc].size = iVar2 + in_RDI[0xc].size;
    local_34 = 0;
    if ((local_11 & 1) != 0) {
      local_34 = 2;
    }
    while( true ) {
      local_48 = in_RDI[0xc].src;
      unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true>::
      operator->((unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>,_true>
                  *)in_stack_ffffffffffffff20);
      local_40 = duckdb_zstd::ZSTD_compressStream2
                           (in_stack_ffffffffffffff58,
                            (ZSTD_outBuffer *)
                            CONCAT17(in_stack_ffffffffffffff57,
                                     CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
                            in_RDI,(ZSTD_EndDirective)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      local_50 = (long)in_RDI[0xc].src - (long)local_48;
      in_RDI[0xc].pos = local_50 + in_RDI[0xc].pos;
      in_RDI[7].pos = local_50 + in_RDI[7].pos;
      uVar1 = duckdb_zstd::ZSTD_isError(0xa34676);
      if (uVar1 != 0) {
        uVar3 = __cxa_allocate_exception(0x10);
        paVar4 = &local_71;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_70,"ZSTD Compression failed: %s",paVar4);
        duckdb_zstd::ZSTD_getErrorName(0xa346c7);
        InvalidInputException::InvalidInputException<char_const*>
                  (in_stack_ffffffffffffff60,(string *)in_stack_ffffffffffffff58,
                   (char *)CONCAT17(in_stack_ffffffffffffff57,
                                    CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)));
        __cxa_throw(uVar3,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
      if (local_40 == 0) break;
      if (in_RDI[0xc].src != (void *)in_RDI[0xb].pos) {
        uVar3 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff58,
                   "Expected ZSTD_compressStream2 to fully utilize the current buffer, but pos is %d, while size is %d"
                   ,(allocator *)&stack0xffffffffffffff57);
        InternalException::InternalException<unsigned_long,unsigned_long>
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   (unsigned_long)in_stack_ffffffffffffff60,(unsigned_long)in_stack_ffffffffffffff58
                  );
        __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
      }
      NewPage(in_stack_ffffffffffffff40,SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
    }
  }
  return;
}

Assistant:

void CompressString(const string_t &string, bool end_of_vector) {
		duckdb_zstd::ZSTD_inBuffer in_buffer = {/*data = */ string.GetData(),
		                                        /*length = */ size_t(string.GetSize()),
		                                        /*pos = */ 0};

		if (!end_of_vector && string.GetSize() == 0) {
			return;
		}
		uncompressed_size += string.GetSize();
		const auto end_mode = end_of_vector ? duckdb_zstd::ZSTD_e_end : duckdb_zstd::ZSTD_e_continue;

		size_t compress_result;
		while (true) {
			idx_t old_pos = out_buffer.pos;

			compress_result =
			    duckdb_zstd::ZSTD_compressStream2(analyze_state->context, &out_buffer, &in_buffer, end_mode);
			D_ASSERT(out_buffer.pos >= old_pos);
			auto diff = out_buffer.pos - old_pos;
			compressed_size += diff;
			current_buffer_ptr += diff;

			if (duckdb_zstd::ZSTD_isError(compress_result)) {
				throw InvalidInputException("ZSTD Compression failed: %s",
				                            duckdb_zstd::ZSTD_getErrorName(compress_result));
			}
			if (compress_result == 0) {
				// Finished
				break;
			}
			if (out_buffer.pos != out_buffer.size) {
				throw InternalException("Expected ZSTD_compressStream2 to fully utilize the current buffer, but pos is "
				                        "%d, while size is %d",
				                        out_buffer.pos, out_buffer.size);
			}
			NewPage();
		}
	}